

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifier.cpp
# Opt level: O0

void __thiscall
vkt::texture::SampleVerifier::fetchTexel
          (SampleVerifier *this,IVec3 *coordIn,int layer,int level,VkFilter filter,Vec4 *resultMin,
          Vec4 *resultMax)

{
  int iVar1;
  VkBorderColor VVar2;
  float fVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  deInt32 dVar7;
  const_reference pvVar8;
  IVec3 *pIVar9;
  int *piVar10;
  float *pfVar11;
  Vector<float,_4> *local_1d0;
  Vector<int,_2> *local_1b8;
  Vector<float,_4> local_19c;
  Vector<float,_4> local_18c;
  Vector<float,_4> local_17c;
  Vector<float,_4> local_16c;
  Vector<float,_4> local_15c;
  Vector<float,_4> local_14c;
  int local_13c;
  int local_138;
  int size;
  int compNdx_1;
  float comp;
  int ndx_1;
  float compMax;
  float compMin;
  int compNdx;
  undefined1 local_110 [16];
  Vector<float,_4> local_100;
  int local_f0;
  int local_ec;
  int cornerLayer;
  int ndx;
  Vec4 cornerTexels [3];
  undefined1 local_b0 [16];
  IVec2 cornerCoords [3];
  int local_88;
  int faces [3];
  undefined1 local_70 [8];
  Vector<int,_3> local_68;
  int newFace;
  IVec2 newCoord;
  int arrayFace;
  int arrayLayer;
  VkSamplerAddressMode VStack_44;
  bool isSrgb;
  VkSamplerAddressMode wrappingModes [3];
  IVec3 coord;
  Vec4 *resultMin_local;
  VkFilter filter_local;
  int level_local;
  int layer_local;
  IVec3 *coordIn_local;
  SampleVerifier *this_local;
  
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(wrappingModes + 1),coordIn);
  arrayLayer = this->m_samplerParams->wrappingModeU;
  VStack_44 = this->m_samplerParams->wrappingModeV;
  wrappingModes[0] = this->m_samplerParams->wrappingModeW;
  bVar4 = ::vk::isSrgbFormat(this->m_imParams->format);
  filter_local = layer;
  if ((this->m_imParams->dim == IMG_DIM_CUBE) && (filter == VK_FILTER_LINEAR)) {
    newCoord.m_data[1] = layer / 6;
    newCoord.m_data[0] = layer % 6;
    bVar5 = coordOutOfRange(this,(IVec3 *)(wrappingModes + 1),0,level);
    bVar6 = coordOutOfRange(this,(IVec3 *)(wrappingModes + 1),1,level);
    if (bVar5 == bVar6) {
      bVar5 = coordOutOfRange(this,(IVec3 *)(wrappingModes + 1),0,level);
      if ((bVar5) && (bVar5 = coordOutOfRange(this,(IVec3 *)(wrappingModes + 1),1,level), bVar5)) {
        cornerCoords[2].m_data[1] = newCoord.m_data[0];
        local_88 = 0;
        faces[0] = 0;
        local_1b8 = (Vector<int,_2> *)(local_b0 + 8);
        do {
          tcu::Vector<int,_2>::Vector(local_1b8);
          local_1b8 = local_1b8 + 1;
        } while (local_1b8 != cornerCoords + 2);
        tcu::Vector<int,_3>::swizzle((Vector<int,_3> *)local_b0,(int)wrappingModes + 4,0);
        pvVar8 = std::
                 vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
                 operator[](this->m_levels,(long)level);
        pIVar9 = tcu::ConstPixelBufferAccess::getSize(pvVar8);
        tcu::Vector<int,_3>::swizzle((Vector<int,_3> *)(cornerTexels[2].m_data + 2),(int)pIVar9,0);
        util::wrapCubemapCorner
                  ((IVec2 *)local_b0,(IVec2 *)(cornerTexels[2].m_data + 2),newCoord.m_data[0],
                   &local_88,faces,(IVec2 *)(local_b0 + 8),cornerCoords,cornerCoords + 1);
        local_1d0 = (Vector<float,_4> *)&cornerLayer;
        do {
          tcu::Vector<float,_4>::Vector(local_1d0);
          local_1d0 = local_1d0 + 1;
        } while (local_1d0 != (Vector<float,_4> *)(cornerTexels[2].m_data + 2));
        for (local_ec = 0; local_ec < 3; local_ec = local_ec + 1) {
          local_f0 = cornerCoords[2].m_data[(long)local_ec + 1] + newCoord.m_data[1] * 6;
          if (bVar4) {
            pvVar8 = std::
                     vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                     ::operator[](this->m_levels,(long)level);
            piVar10 = tcu::Vector<int,_2>::operator[](cornerCoords + (long)local_ec + -1,0);
            iVar1 = *piVar10;
            piVar10 = tcu::Vector<int,_2>::operator[](cornerCoords + (long)local_ec + -1,1);
            tcu::ConstPixelBufferAccess::getPixel
                      ((ConstPixelBufferAccess *)local_110,(int)pvVar8,iVar1,*piVar10);
            tcu::sRGBToLinear((tcu *)&local_100,(Vec4 *)local_110);
            tcu::Vector<float,_4>::operator+=
                      ((Vector<float,_4> *)(&cornerLayer + (long)local_ec * 4),&local_100);
          }
          else {
            pvVar8 = std::
                     vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                     ::operator[](this->m_levels,(long)level);
            piVar10 = tcu::Vector<int,_2>::operator[](cornerCoords + (long)local_ec + -1,0);
            iVar1 = *piVar10;
            piVar10 = tcu::Vector<int,_2>::operator[](cornerCoords + (long)local_ec + -1,1);
            tcu::ConstPixelBufferAccess::getPixel
                      ((ConstPixelBufferAccess *)&compMin,(int)pvVar8,iVar1,*piVar10);
            tcu::Vector<float,_4>::operator+=
                      ((Vector<float,_4> *)(&cornerLayer + (long)local_ec * 4),
                       (Vector<float,_4> *)&compMin);
          }
        }
        for (compMax = 0.0; (int)compMax < 4; compMax = (float)((int)compMax + 1)) {
          pfVar11 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)&cornerLayer,(int)compMax)
          ;
          ndx_1 = (int)*pfVar11;
          pfVar11 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)&cornerLayer,(int)compMax)
          ;
          comp = *pfVar11;
          for (compNdx_1 = 1; iVar1 = ndx_1, compNdx_1 < 3; compNdx_1 = compNdx_1 + 1) {
            pfVar11 = tcu::Vector<float,_4>::operator[]
                                ((Vector<float,_4> *)(&cornerLayer + (long)compNdx_1 * 4),
                                 (int)compMax);
            size = (int)*pfVar11;
            ndx_1 = (int)de::min<float>((float)size,(float)ndx_1);
            comp = de::max<float>((float)size,comp);
          }
          pfVar11 = tcu::Vector<float,_4>::operator[](resultMin,(int)compMax);
          fVar3 = comp;
          *pfVar11 = (float)iVar1;
          pfVar11 = tcu::Vector<float,_4>::operator[](resultMax,(int)compMax);
          *pfVar11 = fVar3;
        }
        return;
      }
    }
    else {
      tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&stack0xffffffffffffffa4,0);
      local_68.m_data[2] = 0;
      tcu::Vector<int,_3>::swizzle((Vector<int,_3> *)(local_70 + 8),(int)wrappingModes + 4,0);
      pvVar8 = std::
               vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
               operator[](this->m_levels,(long)level);
      pIVar9 = tcu::ConstPixelBufferAccess::getSize(pvVar8);
      tcu::Vector<int,_3>::swizzle((Vector<int,_3> *)local_70,(int)pIVar9,0);
      util::wrapCubemapEdge
                ((IVec2 *)(local_70 + 8),(IVec2 *)local_70,newCoord.m_data[0],
                 (IVec2 *)&stack0xffffffffffffffa4,local_68.m_data + 2);
      join_0x00000010_0x00000000_ = tcu::Vector<int,_3>::xy((Vector<int,_3> *)(wrappingModes + 1));
      tcu::VecAccess<int,_3,_2>::operator=
                ((VecAccess<int,_3,_2> *)(faces + 1),(Vector<int,_2> *)&stack0xffffffffffffffa4);
      filter_local = newCoord.m_data[1] * 6 + local_68.m_data[2];
    }
  }
  else {
    if (this->m_imParams->dim == IMG_DIM_CUBE) {
      wrappingModes[0] = VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE;
      VStack_44 = VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE;
      arrayLayer = 2;
    }
    for (local_138 = 0; local_138 < 3; local_138 = local_138 + 1) {
      pvVar8 = std::
               vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
               operator[](this->m_levels,(long)level);
      pIVar9 = tcu::ConstPixelBufferAccess::getSize(pvVar8);
      piVar10 = tcu::Vector<int,_3>::operator[](pIVar9,local_138);
      local_13c = *piVar10;
      piVar10 = tcu::Vector<int,_3>::operator[]((Vector<int,_3> *)(wrappingModes + 1),local_138);
      dVar7 = util::wrapTexelCoord(*piVar10,local_13c,(&arrayLayer)[local_138]);
      piVar10 = tcu::Vector<int,_3>::operator[]((Vector<int,_3> *)(wrappingModes + 1),local_138);
      *piVar10 = dVar7;
    }
  }
  bVar4 = coordOutOfRange(this,(IVec3 *)(wrappingModes + 1),0,level);
  if (((bVar4) || (bVar4 = coordOutOfRange(this,(IVec3 *)(wrappingModes + 1),1,level), bVar4)) ||
     (bVar4 = coordOutOfRange(this,(IVec3 *)(wrappingModes + 1),2,level), bVar4)) {
    VVar2 = this->m_samplerParams->borderColor;
    if (VVar2 == VK_BORDER_COLOR_FLOAT_TRANSPARENT_BLACK) {
      tcu::Vector<float,_4>::Vector(&local_14c,0.0,0.0,0.0,0.0);
      *(undefined8 *)resultMin->m_data = local_14c.m_data._0_8_;
      *(undefined8 *)(resultMin->m_data + 2) = local_14c.m_data._8_8_;
      tcu::Vector<float,_4>::Vector(&local_15c,0.0,0.0,0.0,0.0);
      *(undefined8 *)resultMax->m_data = local_15c.m_data._0_8_;
      *(undefined8 *)(resultMax->m_data + 2) = local_15c.m_data._8_8_;
    }
    else if (VVar2 == VK_BORDER_COLOR_FLOAT_OPAQUE_BLACK) {
      tcu::Vector<float,_4>::Vector(&local_16c,0.0,0.0,0.0,1.0);
      *(undefined8 *)resultMin->m_data = local_16c.m_data._0_8_;
      *(undefined8 *)(resultMin->m_data + 2) = local_16c.m_data._8_8_;
      tcu::Vector<float,_4>::Vector(&local_17c,0.0,0.0,0.0,1.0);
      *(undefined8 *)resultMax->m_data = local_17c.m_data._0_8_;
      *(undefined8 *)(resultMax->m_data + 2) = local_17c.m_data._8_8_;
    }
    else if (VVar2 == VK_BORDER_COLOR_FLOAT_OPAQUE_WHITE) {
      tcu::Vector<float,_4>::Vector(&local_18c,1.0,1.0,1.0,1.0);
      *(undefined8 *)resultMin->m_data = local_18c.m_data._0_8_;
      *(undefined8 *)(resultMin->m_data + 2) = local_18c.m_data._8_8_;
      tcu::Vector<float,_4>::Vector(&local_19c,1.0,1.0,1.0,1.0);
      *(undefined8 *)resultMax->m_data = local_19c.m_data._0_8_;
      *(undefined8 *)(resultMax->m_data + 2) = local_19c.m_data._8_8_;
    }
  }
  else {
    fetchTexelWrapped(this,(IVec3 *)(wrappingModes + 1),filter_local,level,resultMin,resultMax);
  }
  return;
}

Assistant:

void SampleVerifier::fetchTexel (const IVec3&	coordIn,
								 int			layer,
								 int			level,
								 VkFilter		filter,
								 Vec4&			resultMin,
								 Vec4&			resultMax) const
{
	IVec3 coord = coordIn;

	VkSamplerAddressMode wrappingModes[] =
	{
		m_samplerParams.wrappingModeU,
		m_samplerParams.wrappingModeV,
		m_samplerParams.wrappingModeW
	};

	const bool isSrgb = isSrgbFormat(m_imParams.format);

	// Wrapping operations


	if (m_imParams.dim == IMG_DIM_CUBE && filter == VK_FILTER_LINEAR)
	{
		// If the image is a cubemap and we are using linear filtering, we do edge or corner wrapping

		const int	arrayLayer = layer / 6;
		int			arrayFace  = layer % 6;

		if (coordOutOfRange(coord, 0, level) != coordOutOfRange(coord, 1, level))
		{
			// Wrap around edge

			IVec2	newCoord(0);
			int		newFace = 0;

			wrapCubemapEdge(coord.swizzle(0, 1),
							m_levels[level].getSize().swizzle(0, 1),
							arrayFace,
							newCoord,
							newFace);

			coord.xy()	= newCoord;
			layer		= arrayLayer * 6 + newFace;
		}
		else if (coordOutOfRange(coord, 0, level) && coordOutOfRange(coord, 1, level))
		{
			// Wrap corner

			int   faces[3] = {arrayFace, 0, 0};
			IVec2 cornerCoords[3];

			wrapCubemapCorner(coord.swizzle(0, 1),
							  m_levels[level].getSize().swizzle(0, 1),
							  arrayFace,
							  faces[1],
							  faces[2],
							  cornerCoords[0],
							  cornerCoords[1],
							  cornerCoords[2]);

			// \todo [2016-08-01 collinbaker] Call into fetchTexelWrapped instead

			Vec4 cornerTexels[3];

			for (int ndx = 0; ndx < 3; ++ndx)
			{
				int cornerLayer = faces[ndx] + arrayLayer * 6;

				if (isSrgb)
				{
				    cornerTexels[ndx] += sRGBToLinear(m_levels[level].getPixel(cornerCoords[ndx][0], cornerCoords[ndx][1], cornerLayer));
				}
				else
				{
					cornerTexels[ndx] += m_levels[level].getPixel(cornerCoords[ndx][0], cornerCoords[ndx][1], cornerLayer);
				}
			}

			for (int compNdx = 0; compNdx < 4; ++compNdx)
			{
				float compMin = cornerTexels[0][compNdx];
				float compMax = cornerTexels[0][compNdx];

				for (int ndx = 1; ndx < 3; ++ndx)
				{
					const float comp = cornerTexels[ndx][compNdx];

					compMin = de::min(comp, compMin);
					compMax = de::max(comp, compMax);
				}

				resultMin[compNdx] = compMin;
				resultMax[compNdx] = compMax;
			}

			return;
		}
		else
		{
			// If no wrapping is necessary, just do nothing
		}
	}
	else
	{
		// Otherwise, we do normal wrapping

		if (m_imParams.dim == IMG_DIM_CUBE)
		{
			wrappingModes[0] = wrappingModes[1] = wrappingModes[2] = VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE;
		}

		for (int compNdx = 0; compNdx < 3; ++compNdx)
		{
			const int size = m_levels[level].getSize()[compNdx];

			coord[compNdx] = wrapTexelCoord(coord[compNdx], size, wrappingModes[compNdx]);
		}
	}

	if (coordOutOfRange(coord, 0, level) ||
		coordOutOfRange(coord, 1, level) ||
		coordOutOfRange(coord, 2, level))
	{
		// If after wrapping coordinates are still out of range, perform texel replacement

		switch (m_samplerParams.borderColor)
		{
			case VK_BORDER_COLOR_FLOAT_TRANSPARENT_BLACK:
			{
				resultMin = Vec4(0.0f, 0.0f, 0.0f, 0.0f);
				resultMax = Vec4(0.0f, 0.0f, 0.0f, 0.0f);
				return;
			}
			case VK_BORDER_COLOR_FLOAT_OPAQUE_BLACK:
			{
				resultMin = Vec4(0.0f, 0.0f, 0.0f, 1.0f);
				resultMax = Vec4(0.0f, 0.0f, 0.0f, 1.0f);
				return;
			}
			case VK_BORDER_COLOR_FLOAT_OPAQUE_WHITE:
			{
				resultMin = Vec4(1.0f, 1.0f, 1.0f, 1.0f);
				resultMax = Vec4(1.0f, 1.0f, 1.0f, 1.0f);
				return;
			}
			default:
			{
				// \\ [2016-07-07 collinbaker] Handle
				// VK_BORDER_COLOR_INT_* borders
				DE_FATAL("Not implemented");
				break;
			}
		}
	}
	else
	{
		// Otherwise, actually fetch a texel

	    fetchTexelWrapped(coord, layer, level, resultMin, resultMax);
	}
}